

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  TestStatus *pTVar1;
  deUint32 dVar2;
  EnvClone *this_00;
  Resources *this_01;
  CreateThread<vkt::api::(anonymous_namespace)::Framebuffer> *this_02;
  allocator_type *__a;
  allocator_type *__a_00;
  Parameters *extraout_RDX;
  pointer this_03;
  ulong __n;
  pointer this_04;
  bool bVar3;
  Parameters deviceParams;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>_>_>
  resources;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  ThreadGroup threads;
  Environment sharedEnv;
  Parameters local_f9;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_f8;
  TestStatus *local_e8;
  undefined8 local_e0;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>_>_>
  local_d8;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  local_c0;
  ThreadGroup local_a8;
  SharedPtr<vkt::api::(anonymous_namespace)::EnvClone> local_78;
  Environment local_68;
  
  local_e8 = __return_storage_ptr__;
  dVar2 = getDefaultTestThreadCount();
  local_e0 = getDefaulDeviceParameters((Context *)this);
  Environment::Environment(&local_68,(Context *)this,dVar2);
  __n = (ulong)dVar2;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector(&local_c0,__n,__a);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>_>_>
  ::vector(&local_d8,__n,__a_00);
  ThreadGroup::ThreadGroup(&local_a8);
  this_03 = local_d8.
            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_04 = local_c0.
            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    pTVar1 = local_e8;
    dVar2 = (deUint32)param_4;
    bVar3 = __n == 0;
    __n = __n - 1;
    if (bVar3) break;
    this_00 = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(this_00,&local_68,(Parameters *)&local_e0,dVar2);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::SharedPtr(&local_78,this_00);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator=(this_04,&local_78);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::release(&local_78);
    this_01 = (Resources *)operator_new(0x108);
    Framebuffer::Resources::Resources(this_01,&this_04->m_ptr->env,extraout_RDX);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>::SharedPtr
              ((SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources> *)&local_78,
               this_01);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>::operator=
              (this_03,(SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources> *)
                       &local_78);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>::release
              ((SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources> *)&local_78);
    this_02 = (CreateThread<vkt::api::(anonymous_namespace)::Framebuffer> *)operator_new(0x88);
    param_4 = &local_f9;
    CreateThread<vkt::api::(anonymous_namespace)::Framebuffer>::CreateThread
              (this_02,&this_04->m_ptr->env,this_03->m_ptr,param_4);
    local_f8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this_02;
    ThreadGroup::add(&local_a8,&local_f8);
    if ((CreateThread<vkt::api::(anonymous_namespace)::Framebuffer> *)
        local_f8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::Framebuffer> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_f8.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_f8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    this_04 = this_04 + 1;
    this_03 = this_03 + 1;
  }
  ThreadGroup::run(local_e8,&local_a8);
  ThreadGroup::~ThreadGroup(&local_a8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Framebuffer::Resources>_>_>
  ::~vector(&local_d8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector(&local_c0);
  return pTVar1;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}